

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoxObjectiveFunction.cpp
# Opt level: O3

int __thiscall
OpenMD::BoxObjectiveFunction::setCoor
          (BoxObjectiveFunction *this,DynamicVector<double,_std::allocator<double>_> *x)

{
  pointer pdVar1;
  pointer pVVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BoxObjectiveFunction *pBVar5;
  uint i;
  int iVar6;
  long lVar7;
  undefined8 *puVar8;
  double *pdVar9;
  Molecule *this_00;
  Mat3x3d *pMVar10;
  uint i_1;
  undefined1 *puVar11;
  double *pdVar12;
  uint j;
  long lVar13;
  undefined1 *puVar14;
  Mat3x3d *pMVar15;
  undefined8 *puVar16;
  double *pdVar17;
  Mat3x3d *pMVar18;
  uint k;
  long lVar19;
  byte bVar20;
  double norm;
  double dVar21;
  undefined1 auVar22 [16];
  bool bVar24;
  undefined8 uVar25;
  Mat3x3d Hmat;
  MoleculeIterator miter;
  Vector3d delta;
  Vector3d posO;
  RectMatrix<double,_3U,_3U> result_1;
  Vector3d posN;
  SquareMatrix3<double> result;
  Mat3x3d eps;
  Mat3x3d test;
  Mat3x3d y;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  double local_278;
  MoleculeIterator local_268;
  BoxObjectiveFunction *local_260;
  Vector3d local_258;
  double local_238 [4];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined8 local_1d8;
  Vector3d local_1c8;
  double local_1a8 [10];
  double local_158 [10];
  double local_108 [6];
  double local_d8;
  double local_d0;
  double local_c8;
  undefined8 local_c0 [9];
  double local_78 [9];
  long lVar23;
  
  bVar20 = 0;
  local_238[0] = 0.0;
  local_238[1] = 0.0;
  lVar7 = 0;
  local_238[2] = 0.0;
  local_1c8.super_Vector<double,_3U>.data_[2] = 0.0;
  local_1c8.super_Vector<double,_3U>.data_[0] = 0.0;
  local_1c8.super_Vector<double,_3U>.data_[1] = 0.0;
  local_258.super_Vector<double,_3U>.data_[2] = 0.0;
  local_258.super_Vector<double,_3U>.data_[0] = 0.0;
  local_258.super_Vector<double,_3U>.data_[1] = 0.0;
  local_268._M_node = (_Base_ptr)0x0;
  local_158[8] = 0.0;
  local_158[6] = 0.0;
  local_158[7] = 0.0;
  local_158[4] = 0.0;
  local_158[5] = 0.0;
  local_158[2] = 0.0;
  local_158[3] = 0.0;
  local_158[0] = 0.0;
  local_158[1] = 0.0;
  pdVar1 = (x->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar9 = local_108;
  local_108[0] = *pdVar1;
  local_108[4] = pdVar1[1];
  local_c8 = pdVar1[2];
  local_108[5] = pdVar1[3] * 0.5;
  local_d0 = pdVar1[3] * 0.5;
  local_d8 = pdVar1[4] * 0.5;
  local_108[1] = pdVar1[5] * 0.5;
  local_108[2] = pdVar1[4] * 0.5;
  local_108[3] = pdVar1[5] * 0.5;
  dVar21 = 0.0;
  do {
    lVar13 = 0;
    do {
      dVar21 = dVar21 + pdVar9[lVar13] * pdVar9[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 != 3);
    lVar7 = lVar7 + 1;
    pdVar9 = pdVar9 + 3;
  } while (lVar7 != 3);
  if (dVar21 < 0.0) {
    dVar21 = sqrt(dVar21);
  }
  else {
    dVar21 = SQRT(dVar21);
  }
  iVar6 = -1;
  if (dVar21 <= 0.7) {
    local_260 = this;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)local_158 + lVar7 + 0x10) =
           *(undefined8 *)((long)local_108 + lVar7 + 0x10);
      uVar25 = *(undefined8 *)((long)local_108 + lVar7 + 8);
      *(undefined8 *)((long)local_158 + lVar7) = *(undefined8 *)((long)local_108 + lVar7);
      *(undefined8 *)((long)local_158 + lVar7 + 8) = uVar25;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    do {
      local_1a8[6] = 0.0;
      local_1a8[7] = 0.0;
      local_1a8[4] = 0.0;
      local_1a8[5] = 0.0;
      local_1a8[2] = 0.0;
      local_1a8[3] = 0.0;
      local_1a8[0] = 0.0;
      local_1a8[1] = 0.0;
      local_1a8[8] = 0.0;
      lVar7 = 0;
      pdVar9 = local_158;
      do {
        lVar13 = 0;
        pdVar12 = local_158;
        do {
          dVar21 = local_1a8[lVar7 * 3 + lVar13];
          lVar19 = 0;
          pdVar17 = pdVar12;
          do {
            dVar21 = dVar21 + pdVar9[lVar19] * *pdVar17;
            lVar19 = lVar19 + 1;
            pdVar17 = pdVar17 + 3;
          } while (lVar19 != 3);
          local_1a8[lVar7 * 3 + lVar13] = dVar21;
          lVar13 = lVar13 + 1;
          pdVar12 = pdVar12 + 1;
        } while (lVar13 != 3);
        lVar7 = lVar7 + 1;
        pdVar9 = pdVar9 + 3;
      } while (lVar7 != 3);
      local_1e8 = ZEXT816(0);
      local_1f8 = ZEXT816(0);
      local_208 = ZEXT816(0);
      local_218 = ZEXT816(0);
      local_1d8 = 0;
      lVar7 = 0;
      pdVar9 = local_1a8;
      puVar11 = local_218;
      do {
        lVar13 = 0;
        do {
          *(double *)(puVar11 + lVar13 * 8) = pdVar9[lVar13] * 0.5;
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar7 = lVar7 + 1;
        puVar11 = puVar11 + 0x18;
        pdVar9 = pdVar9 + 3;
      } while (lVar7 != 3);
      local_288 = ZEXT816(0);
      local_298 = ZEXT816(0);
      local_2a8 = ZEXT816(0);
      local_2b8 = ZEXT816(0);
      local_278 = 0.0;
      lVar7 = 0;
      pdVar9 = local_108;
      puVar11 = local_218;
      puVar14 = local_2b8;
      do {
        lVar13 = 0;
        do {
          *(double *)(puVar14 + lVar13 * 8) = pdVar9[lVar13] - *(double *)(puVar11 + lVar13 * 8);
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar7 = lVar7 + 1;
        puVar14 = puVar14 + 0x18;
        puVar11 = puVar11 + 0x18;
        pdVar9 = pdVar9 + 3;
      } while (lVar7 != 3);
      pdVar9 = (double *)local_2b8;
      pdVar12 = local_78;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pdVar12 = *pdVar9;
        pdVar9 = pdVar9 + (ulong)bVar20 * -2 + 1;
        pdVar12 = pdVar12 + (ulong)bVar20 * -2 + 1;
      }
      local_288 = ZEXT816(0);
      local_298 = ZEXT816(0);
      local_2a8 = ZEXT816(0);
      local_2b8 = ZEXT816(0);
      local_278 = 0.0;
      lVar7 = 0;
      pdVar9 = local_78;
      pdVar12 = local_158;
      puVar11 = local_2b8;
      do {
        lVar13 = 0;
        do {
          *(double *)(puVar11 + lVar13 * 8) = pdVar9[lVar13] - pdVar12[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar7 = lVar7 + 1;
        puVar11 = puVar11 + 0x18;
        pdVar12 = pdVar12 + 3;
        pdVar9 = pdVar9 + 3;
      } while (lVar7 != 3);
      puVar8 = (undefined8 *)local_2b8;
      puVar16 = local_c0;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *puVar16 = *puVar8;
        puVar8 = puVar8 + (ulong)bVar20 * -2 + 1;
        puVar16 = puVar16 + (ulong)bVar20 * -2 + 1;
      }
      dVar21 = 0.0;
      lVar7 = 0;
      puVar8 = local_c0;
      do {
        lVar13 = 0;
        do {
          dVar21 = dVar21 + (double)puVar8[lVar13] * (double)puVar8[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        lVar7 = lVar7 + 1;
        puVar8 = puVar8 + 3;
      } while (lVar7 != 3);
      if (dVar21 < 0.0) {
        dVar21 = sqrt(dVar21);
      }
      else {
        dVar21 = SQRT(dVar21);
      }
      pBVar5 = local_260;
      pdVar9 = local_78;
      pdVar12 = local_158;
      for (lVar7 = 9; lVar7 != 0; lVar7 = lVar7 + -1) {
        *pdVar12 = *pdVar9;
        pdVar9 = pdVar9 + (ulong)bVar20 * -2 + 1;
        pdVar12 = pdVar12 + (ulong)bVar20 * -2 + 1;
      }
    } while (1e-10 < dVar21);
    pdVar9 = local_1a8 + 1;
    local_1a8[6] = 0.0;
    local_1a8[7] = 0.0;
    local_1a8[4] = 0.0;
    local_1a8[5] = 0.0;
    local_1a8[2] = 0.0;
    local_1a8[3] = 0.0;
    local_1a8[0] = 0.0;
    local_1a8[1] = 0.0;
    local_1a8[8] = 0.0;
    lVar7 = 0;
    lVar13 = 0;
    do {
      lVar19 = 0;
      auVar22 = _DAT_002941f0;
      do {
        bVar24 = SUB164(auVar22 ^ _DAT_00294200,4) == -0x80000000 &&
                 SUB164(auVar22 ^ _DAT_00294200,0) < -0x7ffffffd;
        if (bVar24) {
          uVar25 = 0x3ff0000000000000;
          if (lVar7 != lVar19) {
            uVar25 = 0;
          }
          *(undefined8 *)((long)pdVar9 + lVar19 + -8) = uVar25;
        }
        if (bVar24) {
          uVar25 = 0x3ff0000000000000;
          if (lVar7 + -8 != lVar19) {
            uVar25 = 0;
          }
          *(undefined8 *)((long)pdVar9 + lVar19) = uVar25;
        }
        lVar23 = auVar22._8_8_;
        auVar22._0_8_ = auVar22._0_8_ + 2;
        auVar22._8_8_ = lVar23 + 2;
        lVar19 = lVar19 + 0x10;
      } while (lVar19 != 0x20);
      lVar13 = lVar13 + 1;
      lVar7 = lVar7 + 8;
      pdVar9 = pdVar9 + 3;
    } while (lVar13 != 3);
    puVar11 = local_218;
    local_1e8 = (undefined1  [16])0x0;
    local_1f8 = (undefined1  [16])0x0;
    local_208 = (undefined1  [16])0x0;
    local_218 = (undefined1  [16])0x0;
    local_1d8 = 0;
    pdVar9 = local_158;
    pdVar12 = local_1a8;
    lVar7 = 0;
    do {
      lVar13 = 0;
      do {
        *(double *)(puVar11 + lVar13 * 8) = pdVar12[lVar13] + pdVar9[lVar13];
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      lVar7 = lVar7 + 1;
      puVar11 = puVar11 + 0x18;
      pdVar9 = pdVar9 + 3;
      pdVar12 = pdVar12 + 3;
    } while (lVar7 != 3);
    lVar7 = 0;
    do {
      *(undefined8 *)(local_2a8 + lVar7) = *(undefined8 *)(local_208 + lVar7);
      uVar25 = *(undefined8 *)(local_218 + lVar7 + 8);
      *(undefined8 *)(local_2b8 + lVar7) = *(undefined8 *)(local_218 + lVar7);
      *(undefined8 *)(local_2b8 + lVar7 + 8) = uVar25;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    pMVar15 = &pBVar5->deformation_;
    lVar7 = 0;
    do {
      *(undefined8 *)
       ((long)(pBVar5->deformation_).super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.
              data_[0] + lVar7 + 0x10) = *(undefined8 *)(local_2a8 + lVar7);
      uVar25 = *(undefined8 *)(local_2b8 + lVar7 + 8);
      puVar8 = (undefined8 *)
               ((long)(pMVar15->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.
                      data_[0] + lVar7);
      *puVar8 = *(undefined8 *)(local_2b8 + lVar7);
      puVar8[1] = uVar25;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x48);
    this_00 = SimInfo::beginMolecule(pBVar5->info_,&local_268);
    if (this_00 != (Molecule *)0x0) {
      lVar7 = 0;
      do {
        pVVar2 = (pBVar5->refPos_).
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_238[2] = pVVar2[lVar7].super_Vector<double,_3U>.data_[2];
        pVVar2 = pVVar2 + lVar7;
        local_238[0] = (pVVar2->super_Vector<double,_3U>).data_[0];
        local_238[1] = (pVVar2->super_Vector<double,_3U>).data_[1];
        Molecule::getCom(&local_1c8,this_00);
        local_218 = ZEXT816(0);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = local_208._8_8_;
        local_208 = auVar3 << 0x40;
        lVar13 = 0;
        pMVar10 = pMVar15;
        do {
          dVar21 = *(double *)(local_218 + lVar13 * 8);
          lVar19 = 0;
          do {
            dVar21 = dVar21 + (pMVar10->super_SquareMatrix<double,_3>).
                              super_RectMatrix<double,_3U,_3U>.data_[0][lVar19] * local_238[lVar19];
            lVar19 = lVar19 + 1;
          } while (lVar19 != 3);
          *(double *)(local_218 + lVar13 * 8) = dVar21;
          lVar13 = lVar13 + 1;
          pMVar10 = (Mat3x3d *)
                    ((pMVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar13 != 3);
        local_2b8 = ZEXT816(0);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = local_2a8._8_8_;
        local_2a8 = auVar4 << 0x40;
        lVar13 = 0;
        do {
          *(double *)(local_2b8 + lVar13 * 8) =
               *(double *)(local_218 + lVar13 * 8) -
               local_1c8.super_Vector<double,_3U>.data_[lVar13];
          lVar13 = lVar13 + 1;
        } while (lVar13 != 3);
        local_258.super_Vector<double,_3U>.data_[2] = (double)local_2a8._0_8_;
        local_258.super_Vector<double,_3U>.data_[0] = (double)local_2b8._0_8_;
        local_258.super_Vector<double,_3U>.data_[1] = (double)local_2b8._8_8_;
        lVar7 = lVar7 + 1;
        Molecule::moveCom(this_00,&local_258);
        this_00 = SimInfo::nextMolecule(pBVar5->info_,&local_268);
      } while (this_00 != (Molecule *)0x0);
    }
    local_288 = (undefined1  [16])0x0;
    local_298 = (undefined1  [16])0x0;
    local_2a8 = (undefined1  [16])0x0;
    local_2b8 = (undefined1  [16])0x0;
    local_278 = 0.0;
    lVar7 = 0;
    do {
      lVar13 = 0;
      pMVar10 = &pBVar5->refHmat_;
      do {
        dVar21 = *(double *)(local_2b8 + lVar13 * 8 + lVar7 * 0x18);
        lVar19 = 0;
        pMVar18 = pMVar10;
        do {
          dVar21 = dVar21 + (pMVar15->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][lVar19] *
                            (pMVar18->super_SquareMatrix<double,_3>).
                            super_RectMatrix<double,_3U,_3U>.data_[0][0];
          lVar19 = lVar19 + 1;
          pMVar18 = (Mat3x3d *)
                    ((pMVar18->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                    + 1);
        } while (lVar19 != 3);
        *(double *)(local_2b8 + lVar13 * 8 + lVar7 * 0x18) = dVar21;
        lVar13 = lVar13 + 1;
        pMVar10 = (Mat3x3d *)
                  ((pMVar10->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_
                   [0] + 1);
      } while (lVar13 != 3);
      lVar7 = lVar7 + 1;
      pMVar15 = (Mat3x3d *)
                ((pMVar15->super_SquareMatrix<double,_3>).super_RectMatrix<double,_3U,_3U>.data_ + 1
                );
    } while (lVar7 != 3);
    Snapshot::setHmat(pBVar5->info_->sman_->currentSnapshot_,(Mat3x3d *)local_2b8);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

int BoxObjectiveFunction::setCoor(const DynamicVector<RealType>& x) {
    Vector3d posO;
    Vector3d posN;
    Vector3d delta;
    SimInfo::MoleculeIterator miter;
    Molecule* mol;
    Mat3x3d eta(0.0);
    Mat3x3d eps(0.0);
    Mat3x3d y(0.0);
    Mat3x3d test(0.0);
    RealType norm;

    // η is the Lagrangian strain tensor:
    eta.setupVoigtTensor(x[0], x[1], x[2], x[3] / 2., x[4] / 2., x[5] / 2.);

    // Make sure the deformation isn't too large:
    if (eta.frobeniusNorm() > 0.7) {
      // Deformation is too large, return an error condition:
      return -1;
    }

    // Find the physical strain tensor, ε, from the Lagrangian strain, η:
    // η = ε + 0.5 * ε^2
    norm = 1.0;
    eps  = eta;
    while (norm > 1.0e-10) {
      y    = eta - eps * eps / 2.0;
      test = y - eps;
      norm = test.frobeniusNorm();
      eps  = y;
    }
    deformation_ = SquareMatrix3<RealType>::identity() + eps;

    int index = 0;

    for (mol = info_->beginMolecule(miter); mol != NULL;
         mol = info_->nextMolecule(miter)) {
      posO  = refPos_[index++];
      posN  = mol->getCom();
      delta = deformation_ * posO - posN;
      mol->moveCom(delta);
    }

    Mat3x3d Hmat = deformation_ * refHmat_;
    info_->getSnapshotManager()->getCurrentSnapshot()->setHmat(Hmat);
    return 0;
  }